

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave-light.c
# Opt level: O1

void borg_update_light(void)

{
  ushort *puVar1;
  byte *pbVar2;
  ushort uVar3;
  int iVar4;
  borg_grid *pbVar5;
  borg_grid *pbVar6;
  bool bVar7;
  long lVar8;
  int *piVar9;
  _Bool _Var10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint8_t uVar14;
  int iVar15;
  ulong uVar16;
  uint8_t uVar17;
  int iVar18;
  long lVar19;
  uint8_t uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  uint8_t uVar24;
  uint uVar25;
  uint8_t uVar26;
  int dy;
  int iVar27;
  ulong uVar28;
  
  if (0 < borg_light_n) {
    lVar13 = 0;
    do {
      borg_grids[borg_light_y[lVar13]][borg_light_x[lVar13]].info =
           borg_grids[borg_light_y[lVar13]][borg_light_x[lVar13]].info & 0xffef;
      lVar13 = lVar13 + 1;
    } while (lVar13 < borg_light_n);
  }
  iVar27 = borg.c.y;
  iVar4 = borg.c.x;
  borg_light_n = 0;
  if (borg_items[(ulong)z_info->pack_size + 5].iqty != '\0') {
    lVar19 = (long)borg.c.y;
    pbVar5 = borg_grids[lVar19];
    lVar13 = (long)borg.c.x;
    pbVar5[lVar13].info = pbVar5[lVar13].info | 0x10;
    uVar14 = (uint8_t)iVar27;
    borg_light_y[borg_light_n] = uVar14;
    uVar24 = (uint8_t)iVar4;
    borg_light_x[borg_light_n] = uVar24;
    piVar9 = borg.trait;
    borg_light_n = borg_light_n + 1;
    if (0 < borg.trait[0x1a]) {
      pbVar6 = borg_grids[lVar19 + 1];
      lVar8 = lVar13 * 0xc;
      pbVar6[lVar13].info = pbVar6[lVar13].info | 0x10;
      uVar26 = uVar14 + '\x01';
      borg_light_y[borg_light_n] = uVar26;
      borg_light_x[borg_light_n] = uVar24;
      borg_light_n = borg_light_n + 1;
      lVar19 = (&DAT_002f9138)[lVar19];
      puVar1 = (ushort *)(lVar19 + 2 + lVar8);
      *puVar1 = *puVar1 | 0x10;
      uVar20 = uVar14 + 0xff;
      borg_light_y[borg_light_n] = uVar20;
      borg_light_x[borg_light_n] = uVar24;
      borg_light_n = borg_light_n + 1;
      *(byte *)&pbVar5[lVar13 + 1].info = (byte)pbVar5[lVar13 + 1].info | 0x10;
      borg_light_y[borg_light_n] = uVar14;
      uVar17 = uVar24 + '\x01';
      borg_light_x[borg_light_n] = uVar17;
      borg_light_n = borg_light_n + 1;
      *(byte *)&pbVar5[lVar13 + -1].info = (byte)pbVar5[lVar13 + -1].info | 0x10;
      borg_light_y[borg_light_n] = uVar14;
      uVar24 = uVar24 + 0xff;
      borg_light_x[borg_light_n] = uVar24;
      borg_light_n = borg_light_n + 1;
      *(byte *)&pbVar6[lVar13 + 1].info = (byte)pbVar6[lVar13 + 1].info | 0x10;
      borg_light_y[borg_light_n] = uVar26;
      borg_light_x[borg_light_n] = uVar17;
      borg_light_n = borg_light_n + 1;
      *(byte *)&pbVar6[lVar13 + -1].info = (byte)pbVar6[lVar13 + -1].info | 0x10;
      borg_light_y[borg_light_n] = uVar26;
      borg_light_x[borg_light_n] = uVar24;
      borg_light_n = borg_light_n + 1;
      pbVar2 = (byte *)(lVar19 + 0xe + lVar8);
      *pbVar2 = *pbVar2 | 0x10;
      borg_light_y[borg_light_n] = uVar20;
      borg_light_x[borg_light_n] = uVar17;
      borg_light_n = borg_light_n + 1;
      pbVar2 = (byte *)(lVar19 + -10 + lVar8);
      *pbVar2 = *pbVar2 | 0x10;
      borg_light_y[borg_light_n] = uVar20;
      borg_light_x[borg_light_n] = uVar24;
      borg_light_n = borg_light_n + 1;
    }
    if ((1 < piVar9[0x1a]) && (iVar4 - 3U < 0xc1 && iVar27 - 3U < 0x3d)) {
      _Var10 = borg_cave_floor_bold(iVar27 + L'\x02',iVar4);
      iVar27 = borg.c.y;
      iVar4 = borg.c.x;
      if (_Var10) {
        pbVar5 = borg_grids[(long)borg.c.y + 2];
        lVar13 = (long)borg.c.x;
        pbVar5[lVar13].info = pbVar5[lVar13].info | 0x10;
        uVar14 = (char)iVar27 + '\x02';
        borg_light_y[borg_light_n] = uVar14;
        uVar24 = (uint8_t)iVar4;
        borg_light_x[borg_light_n] = uVar24;
        borg_light_n = borg_light_n + 1;
        *(byte *)&pbVar5[lVar13 + 2].info = (byte)pbVar5[lVar13 + 2].info | 0x10;
        borg_light_y[borg_light_n] = uVar14;
        borg_light_x[borg_light_n] = uVar24 + '\x02';
        borg_light_n = borg_light_n + 1;
        *(byte *)&pbVar5[lVar13 + -2].info = (byte)pbVar5[lVar13 + -2].info | 0x10;
        borg_light_y[borg_light_n] = uVar14;
        borg_light_x[borg_light_n] = uVar24 + 0xfe;
        borg_light_n = borg_light_n + 1;
      }
      _Var10 = borg_cave_floor_bold(borg.c.y + L'\xfffffffe',borg.c.x);
      iVar27 = borg.c.y;
      iVar4 = borg.c.x;
      if (_Var10) {
        lVar13 = *(long *)(borg_view_x + (long)borg.c.y * 8 + 0x2320);
        lVar19 = (long)borg.c.x;
        puVar1 = (ushort *)(lVar13 + 2 + lVar19 * 0xc);
        *puVar1 = *puVar1 | 0x10;
        uVar14 = (char)iVar27 + 0xfe;
        borg_light_y[borg_light_n] = uVar14;
        uVar24 = (uint8_t)iVar4;
        borg_light_x[borg_light_n] = uVar24;
        borg_light_n = borg_light_n + 1;
        pbVar2 = (byte *)(lVar13 + 0x1a + lVar19 * 0xc);
        *pbVar2 = *pbVar2 | 0x10;
        borg_light_y[borg_light_n] = uVar14;
        borg_light_x[borg_light_n] = uVar24 + '\x02';
        borg_light_n = borg_light_n + 1;
        pbVar2 = (byte *)(lVar13 + -0x16 + lVar19 * 0xc);
        *pbVar2 = *pbVar2 | 0x10;
        borg_light_y[borg_light_n] = uVar14;
        borg_light_x[borg_light_n] = uVar24 + 0xfe;
        borg_light_n = borg_light_n + 1;
      }
      _Var10 = borg_cave_floor_bold(borg.c.y,borg.c.x + L'\x02');
      iVar27 = borg.c.y;
      iVar4 = borg.c.x;
      if (_Var10) {
        lVar19 = (long)borg.c.y;
        lVar13 = (long)borg.c.x;
        borg_grids[lVar19][lVar13 + 2].info = borg_grids[lVar19][lVar13 + 2].info | 0x10;
        uVar14 = (uint8_t)iVar27;
        borg_light_y[borg_light_n] = uVar14;
        uVar24 = (char)iVar4 + '\x02';
        borg_light_x[borg_light_n] = uVar24;
        borg_light_n = borg_light_n + 1;
        borg_grids[lVar19 + 1][lVar13 + 2].info = borg_grids[lVar19 + 1][lVar13 + 2].info | 0x10;
        borg_light_y[borg_light_n] = uVar14 + '\x01';
        borg_light_x[borg_light_n] = uVar24;
        borg_light_n = borg_light_n + 1;
        puVar1 = (ushort *)((&DAT_002f9138)[lVar19] + 0x1a + lVar13 * 0xc);
        *puVar1 = *puVar1 | 0x10;
        borg_light_y[borg_light_n] = uVar14 + 0xff;
        borg_light_x[borg_light_n] = uVar24;
        borg_light_n = borg_light_n + 1;
      }
      _Var10 = borg_cave_floor_bold(borg.c.y,borg.c.x + L'\xfffffffe');
      iVar27 = borg.c.y;
      iVar4 = borg.c.x;
      if (_Var10) {
        lVar19 = (long)borg.c.y;
        lVar13 = (long)borg.c.x;
        borg_grids[lVar19][lVar13 + -2].info = borg_grids[lVar19][lVar13 + -2].info | 0x10;
        uVar14 = (uint8_t)iVar27;
        borg_light_y[borg_light_n] = uVar14;
        uVar24 = (char)iVar4 + 0xfe;
        borg_light_x[borg_light_n] = uVar24;
        borg_light_n = borg_light_n + 1;
        borg_grids[lVar19 + 2][lVar13 + -2].info = borg_grids[lVar19 + 2][lVar13 + -2].info | 0x10;
        borg_light_y[borg_light_n] = uVar14 + '\x02';
        borg_light_x[borg_light_n] = uVar24;
        borg_light_n = borg_light_n + 1;
        puVar1 = (ushort *)(*(long *)(borg_view_x + lVar19 * 8 + 0x2320) + -0x16 + lVar13 * 0xc);
        *puVar1 = *puVar1 | 0x10;
        borg_light_y[borg_light_n] = uVar14 + 0xfe;
        borg_light_x[borg_light_n] = uVar24;
        borg_light_n = borg_light_n + 1;
      }
    }
    iVar4 = borg.trait[0x1a];
    if (((2 < iVar4) && (borg.c.y - 4U < 0x3b)) && (borg.c.x - 4U < 0xbf)) {
      iVar27 = 5;
      if (iVar4 < 5) {
        iVar27 = iVar4;
      }
      _Var10 = borg_cave_floor_bold(borg.c.y + L'\x03',borg.c.x + L'\x03');
      iVar15 = borg.c.y;
      iVar4 = borg.c.x;
      if (_Var10) {
        borg_grids[(long)borg.c.y + 3][(long)borg.c.x + 3].info =
             borg_grids[(long)borg.c.y + 3][(long)borg.c.x + 3].info | 0x10;
        borg_light_y[borg_light_n] = (char)iVar15 + '\x03';
        borg_light_x[borg_light_n] = (char)iVar4 + '\x03';
        borg_light_n = borg_light_n + 1;
      }
      _Var10 = borg_cave_floor_bold(borg.c.y + L'\x03',borg.c.x + L'\xfffffffd');
      iVar15 = borg.c.y;
      iVar4 = borg.c.x;
      if (_Var10) {
        borg_grids[(long)borg.c.y + 3][(long)borg.c.x + -3].info =
             borg_grids[(long)borg.c.y + 3][(long)borg.c.x + -3].info | 0x10;
        borg_light_y[borg_light_n] = (char)iVar15 + '\x03';
        borg_light_x[borg_light_n] = (char)iVar4 + 0xfd;
        borg_light_n = borg_light_n + 1;
      }
      _Var10 = borg_cave_floor_bold(borg.c.y + L'\xfffffffd',borg.c.x + L'\x03');
      iVar15 = borg.c.y;
      iVar4 = borg.c.x;
      if (_Var10) {
        puVar1 = (ushort *)
                 (*(long *)(borg_view_x + (long)borg.c.y * 8 + 0x2318) + 0x26 + (long)borg.c.x * 0xc
                 );
        *puVar1 = *puVar1 | 0x10;
        borg_light_y[borg_light_n] = (char)iVar15 + 0xfd;
        borg_light_x[borg_light_n] = (char)iVar4 + '\x03';
        borg_light_n = borg_light_n + 1;
      }
      _Var10 = borg_cave_floor_bold(borg.c.y + L'\xfffffffd',borg.c.x + L'\xfffffffd');
      iVar15 = borg.c.y;
      iVar4 = borg.c.x;
      if (_Var10) {
        puVar1 = (ushort *)
                 (*(long *)(borg_view_x + (long)borg.c.y * 8 + 0x2318) + -0x22 +
                 (long)borg.c.x * 0xc);
        *puVar1 = *puVar1 | 0x10;
        borg_light_y[borg_light_n] = (char)iVar15 + 0xfd;
        borg_light_x[borg_light_n] = (char)iVar4 + 0xfd;
        borg_light_n = borg_light_n + 1;
      }
      iVar4 = borg.c.y;
      uVar28 = 0;
      uVar11 = borg.c.y - iVar27;
      if (borg.c.y - iVar27 < 1) {
        uVar11 = 0;
      }
      iVar15 = 0x41;
      if (borg.c.y + iVar27 < 0x41) {
        iVar15 = borg.c.y + iVar27;
      }
      if ((int)uVar11 <= iVar15) {
        iVar18 = 0xc5;
        if (borg.c.x + iVar27 < 0xc5) {
          iVar18 = borg.c.x + iVar27;
        }
        if (0 < borg.c.x - iVar27) {
          uVar28 = (ulong)(uint)(borg.c.x - iVar27);
        }
        uVar22 = borg.c.x - (int)uVar28;
        uVar21 = (ulong)uVar11;
        do {
          if ((int)uVar28 <= iVar18) {
            uVar12 = iVar4 - (int)uVar21;
            uVar11 = -uVar12;
            if (0 < (int)uVar12) {
              uVar11 = uVar12;
            }
            uVar16 = uVar28;
            lVar13 = uVar28 * 0xc + 2;
            uVar12 = uVar22;
            do {
              uVar25 = -uVar12;
              if (0 < (int)uVar12) {
                uVar25 = uVar12;
              }
              if ((2 < uVar11) || (2 < uVar25)) {
                iVar23 = uVar25 + (uVar11 >> 1);
                if (uVar25 < uVar11) {
                  iVar23 = (uVar25 >> 1) + uVar11;
                }
                if (iVar23 <= iVar27) {
                  uVar3 = *(ushort *)(&borg_grids[uVar21]->feat + lVar13);
                  if ((uVar3 & 0x20) != 0) {
                    *(ushort *)(&borg_grids[uVar21]->feat + lVar13) = uVar3 | 0x10;
                    borg_light_y[borg_light_n] = (uint8_t)uVar21;
                    borg_light_x[borg_light_n] = (uint8_t)uVar16;
                    borg_light_n = borg_light_n + 1;
                  }
                }
              }
              uVar12 = uVar12 - 1;
              lVar13 = lVar13 + 0xc;
              bVar7 = (long)uVar16 < (long)iVar18;
              uVar16 = uVar16 + 1;
            } while (bVar7);
          }
          bVar7 = (long)uVar21 < (long)iVar15;
          uVar21 = uVar21 + 1;
        } while (bVar7);
      }
    }
  }
  return;
}

Assistant:

void borg_update_light(void)
{
    int i, x, y, min_x, max_x, min_y, max_y;

    /*** Clear old grids ***/

    /* Clear them all */
    for (i = 0; i < borg_light_n; i++) {
        y = borg_light_y[i];
        x = borg_light_x[i];

        /* Mark the grid as not "lite" */
        borg_grids[y][x].info &= ~BORG_LIGHT;
    }

    /* None left */
    borg_light_n = 0;

    /* Hack -- Player has no lite */
    if (borg_items[INVEN_LIGHT].iqty <= 0)
        return;

    /*** Collect the new "lite" grids ***/

    /* Player grid */
    borg_cave_light_hack(borg.c.y, borg.c.x);

    /* Radius 1 -- torch radius */
    if (borg.trait[BI_LIGHT] >= 1) {
        /* Adjacent grid */
        borg_cave_light_hack(borg.c.y + 1, borg.c.x);
        borg_cave_light_hack(borg.c.y - 1, borg.c.x);
        borg_cave_light_hack(borg.c.y, borg.c.x + 1);
        borg_cave_light_hack(borg.c.y, borg.c.x - 1);

        /* Diagonal grids */
        borg_cave_light_hack(borg.c.y + 1, borg.c.x + 1);
        borg_cave_light_hack(borg.c.y + 1, borg.c.x - 1);
        borg_cave_light_hack(borg.c.y - 1, borg.c.x + 1);
        borg_cave_light_hack(borg.c.y - 1, borg.c.x - 1);
    }

    /* Radius 2 -- lantern radius */
    if (borg.trait[BI_LIGHT] >= 2 && borg.c.y + 2 < AUTO_MAX_Y
        && borg.c.y - 2 > 0 && borg.c.x + 2 < AUTO_MAX_X && borg.c.x - 2 > 0) {
        /* South of the player */
        if (borg_cave_floor_bold(borg.c.y + 2, borg.c.x)) {
            borg_cave_light_hack(borg.c.y + 2, borg.c.x);
            borg_cave_light_hack(borg.c.y + 2, borg.c.x + 2);
            borg_cave_light_hack(borg.c.y + 2, borg.c.x - 2);
        }

        /* North of the player */
        if (borg_cave_floor_bold(borg.c.y - 2, borg.c.x)) {
            borg_cave_light_hack(borg.c.y - 2, borg.c.x);
            borg_cave_light_hack(borg.c.y - 2, borg.c.x + 2);
            borg_cave_light_hack(borg.c.y - 2, borg.c.x - 2);
        }

        /* East of the player */
        if (borg_cave_floor_bold(borg.c.y, borg.c.x + 2)) {
            borg_cave_light_hack(borg.c.y, borg.c.x + 2);
            borg_cave_light_hack(borg.c.y + 1, borg.c.x + 2);
            borg_cave_light_hack(borg.c.y - 1, borg.c.x + 2);
        }

        /* West of the player */
        if (borg_cave_floor_bold(borg.c.y, borg.c.x - 2)) {
            borg_cave_light_hack(borg.c.y, borg.c.x - 2);
            borg_cave_light_hack(borg.c.y + 2, borg.c.x - 2);
            borg_cave_light_hack(borg.c.y - 2, borg.c.x - 2);
        }
    }

    /* Radius 3+ -- artifact radius */
    if (borg.trait[BI_LIGHT] >= 3 && borg.c.y + 3 < AUTO_MAX_Y
        && borg.c.y - 3 > 0 && borg.c.x + 3 < AUTO_MAX_X && borg.c.x - 3 > 0) {
        int d, p;

        /* Maximal radius */
        p = borg.trait[BI_LIGHT];

        /* Paranoia -- see "LITE_MAX" */
        if (p > 5)
            p = 5;

        /* South-East of the player */
        if (borg_cave_floor_bold(borg.c.y + 3, borg.c.x + 3)) {
            borg_cave_light_hack(borg.c.y + 3, borg.c.x + 3);
        }

        /* South-West of the player */
        if (borg_cave_floor_bold(borg.c.y + 3, borg.c.x - 3)) {
            borg_cave_light_hack(borg.c.y + 3, borg.c.x - 3);
        }

        /* North-East of the player */
        if (borg_cave_floor_bold(borg.c.y - 3, borg.c.x + 3)) {
            borg_cave_light_hack(borg.c.y - 3, borg.c.x + 3);
        }

        /* North-West of the player */
        if (borg_cave_floor_bold(borg.c.y - 3, borg.c.x - 3)) {
            borg_cave_light_hack(borg.c.y - 3, borg.c.x - 3);
        }

        /* Maximal north */
        min_y = borg.c.y - p;
        if (min_y < 0)
            min_y = 0;

        /* Maximal south */
        max_y = borg.c.y + p;
        if (max_y > AUTO_MAX_Y - 1)
            max_y = AUTO_MAX_Y - 1;

        /* Maximal west */
        min_x = borg.c.x - p;
        if (min_x < 0)
            min_x = 0;

        /* Maximal east */
        max_x = borg.c.x + p;
        if (max_x > AUTO_MAX_X - 1)
            max_x = AUTO_MAX_X - 1;

        /* Scan the maximal box */
        for (y = min_y; y <= max_y; y++) {
            for (x = min_x; x <= max_x; x++) {
                int dy = (borg.c.y > y) ? (borg.c.y - y) : (y - borg.c.y);
                int dx = (borg.c.x > x) ? (borg.c.x - x) : (x - borg.c.x);

                /* Skip the "central" grids (above) */
                if ((dy <= 2) && (dx <= 2))
                    continue;

                /* Hack -- approximate the distance */
                d = (dy > dx) ? (dy + (dx >> 1)) : (dx + (dy >> 1));

                /* Skip distant grids */
                if (d > p)
                    continue;

                /* Viewable, nearby, grids get "torch lit" */
                if (borg_grids[y][x].info & BORG_VIEW) {
                    /* This grid is "torch lit" */
                    borg_cave_light_hack(y, x);
                }
            }
        }
    }
}